

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O1

size_t absl::lts_20250127::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  Duration num;
  uint uVar4;
  TimeZone *this;
  Nonnull<char_*> pcVar5;
  ulong uVar6;
  Nonnull<char_*> pcVar7;
  undefined8 extraout_RAX;
  char *pcVar8;
  HiRep HVar9;
  char *pcVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  undefined8 extraout_RDX_01;
  lts_20250127 *__n;
  LogSeverity unaff_EBP;
  int64_t iVar12;
  pointer pcVar13;
  Nonnull<char_*> output;
  int iVar14;
  Nonnull<char_*> buffer;
  HiRep unaff_R14;
  Nonnull<char_*> unaff_R15;
  Time t;
  timeval tVar15;
  CivilInfo ci;
  char *local_88;
  int local_78;
  int local_74;
  Duration local_70;
  CivilInfo local_60;
  
  pcVar10 = basename._M_str;
  __n = (lts_20250127 *)basename._M_len;
  if (buf->len_ < 0x22) {
    buf->len_ = 0;
    pcVar5 = (Nonnull<char_*>)0x0;
    severity = unaff_EBP;
  }
  else {
    output = (Nonnull<char_*>)(ulong)(uint)tid;
    unaff_R15 = (Nonnull<char_*>)(ulong)timestamp.rep_.rep_lo_;
    this = TimeZone();
    uVar11 = extraout_RDX;
    pcVar5 = output;
    unaff_R14 = timestamp.rep_.rep_hi_;
    local_88 = pcVar10;
    if (this == (TimeZone *)0x0) goto LAB_0024c442;
    pcVar1 = buf->ptr_;
    if (severity < 4) {
      pcVar8 = (&PTR_anon_var_dwarf_621fad_0035cc38)[severity];
    }
    else {
      pcVar8 = "UNKNOWN";
    }
    *pcVar1 = *pcVar8;
    lts_20250127::TimeZone::At(&local_60,this,timestamp);
    numbers_internal::PutTwoDigits((int)local_60.cs.f_.m,pcVar1 + 1);
    numbers_internal::PutTwoDigits((int)local_60.cs.f_.d,pcVar1 + 3);
    pcVar1[5] = ' ';
    numbers_internal::PutTwoDigits((int)local_60.cs.f_.hh,pcVar1 + 6);
    pcVar1[8] = ':';
    numbers_internal::PutTwoDigits((int)local_60.cs.f_.mm,pcVar1 + 9);
    pcVar1[0xb] = ':';
    numbers_internal::PutTwoDigits((int)local_60.cs.f_.ss,pcVar1 + 0xc);
    unaff_R15 = pcVar1 + 0xf;
    pcVar1[0xe] = '.';
    num.rep_lo_ = local_60.subsecond.rep_lo_;
    num.rep_hi_ = local_60.subsecond.rep_hi_;
    if ((ulong)local_60.subsecond.rep_hi_ >> 0x2b == 0) {
      iVar12 = (ulong)local_60.subsecond.rep_lo_ / 4000 + (long)local_60.subsecond.rep_hi_ * 1000000
      ;
    }
    else {
      local_70.rep_hi_ = local_60.subsecond.rep_hi_;
      local_70.rep_lo_ = local_60.subsecond.rep_lo_;
      iVar12 = IDivDuration(num,(Duration)(ZEXT412(4000) << 0x40),&local_70);
    }
    numbers_internal::PutTwoDigits
              ((int)(SUB168(SEXT816(iVar12) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
               (SUB164(SEXT816(iVar12) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f),unaff_R15);
    unaff_R14 = (HiRep)(iVar12 / 100);
    numbers_internal::PutTwoDigits
              (unaff_R14.lo_ +
               ((int)(SUB168(SEXT816((long)unaff_R14) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
               (SUB164(SEXT816((long)unaff_R14) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100,
               pcVar1 + 0x11);
    severity = (int)iVar12 + unaff_R14.lo_ * -100;
    numbers_internal::PutTwoDigits(severity,pcVar1 + 0x13);
    pcVar1[0x15] = ' ';
    if ((uint)tid < 10) {
      pcVar1[0x16] = ' ';
      buffer = pcVar1 + 0x17;
    }
    else {
      buffer = pcVar1 + 0x16;
    }
    if (tid + 9U < 0x6d) {
      *buffer = ' ';
      buffer = buffer + 1;
    }
    if (tid + 99U < 1099) {
      *buffer = ' ';
      buffer = buffer + 1;
    }
    if (tid + 999U < 10999) {
      *buffer = ' ';
      buffer = buffer + 1;
    }
    if (tid + 9999U < 109999) {
      *buffer = ' ';
      buffer = buffer + 1;
    }
    if (tid + 99999U < 1099999) {
      *buffer = ' ';
      buffer = buffer + 1;
    }
    pcVar5 = numbers_internal::FastIntToBuffer(tid,buffer);
    *pcVar5 = ' ';
    pcVar5 = pcVar5 + (1 - (long)buf->ptr_);
    if ((Nonnull<char_*>)buf->len_ < pcVar5) {
      FormatLogPrefix();
      goto LAB_0024c48c;
    }
    buf->ptr_ = pcVar5 + (long)buf->ptr_;
    buf->len_ = (long)buf->len_ - (long)pcVar5;
  }
  do {
    while( true ) {
      if ((lts_20250127 *)buf->len_ < __n) {
        __n = (lts_20250127 *)buf->len_;
      }
      memcpy(buf->ptr_,pcVar10,(size_t)__n);
      uVar6 = (long)buf->len_ - (long)__n;
      if ((lts_20250127 *)buf->len_ < __n) break;
      pcVar13 = buf->ptr_ + (long)__n;
      buf->ptr_ = pcVar13;
      buf->len_ = uVar6;
      if (uVar6 < 0xe) {
        HVar9.lo_ = 0;
        HVar9.hi_ = 0;
        pcVar7 = (Nonnull<char_*>)0x0;
      }
      else {
        output = (Nonnull<char_*>)(ulong)(uint)line;
        *pcVar13 = ':';
        buffer = pcVar13 + 1;
        pcVar7 = numbers_internal::FastIntToBuffer(line,buffer);
        pcVar7[0] = ']';
        pcVar7[1] = ' ';
        pcVar7 = pcVar7 + (2 - (long)buf->ptr_);
        HVar9 = (HiRep)((long)buf->len_ - (long)pcVar7);
        if ((Nonnull<char_*>)buf->len_ < pcVar7) {
LAB_0024c48c:
          iVar14 = (int)pcVar5;
          FormatLogPrefix();
          auVar2._8_8_ = extraout_RDX_01;
          auVar2._0_8_ = extraout_RAX;
          auVar3 = auVar2._0_12_;
          goto LAB_0024c491;
        }
        buf->ptr_ = buf->ptr_ + (long)pcVar7;
      }
      __n = __n + (long)pcVar5 + (long)pcVar7;
      buf->len_ = (size_type)HVar9;
      if (format != kRaw) {
        return (size_t)__n;
      }
      unaff_R14.lo_ = 5;
      unaff_R14.hi_ = 0;
      if ((ulong)HVar9 < 5) {
        unaff_R14 = HVar9;
      }
      memcpy(buf->ptr_,"RAW: ",(size_t)unaff_R14);
      if ((ulong)unaff_R14 <= buf->len_) {
        buf->ptr_ = buf->ptr_ + (long)unaff_R14;
        buf->len_ = buf->len_ - (long)unaff_R14;
        return (size_t)(__n + (long)unaff_R14);
      }
      FormatLogPrefix();
LAB_0024c4da:
      pcVar5 = (Nonnull<char_*>)0x0;
      pcVar10 = local_88;
    }
    FormatLogPrefix();
    uVar11 = extraout_RDX_00;
LAB_0024c442:
    iVar14 = (int)pcVar5;
    t.rep_.rep_hi_ = (HiRep)((ulong)unaff_R15 & 0xffffffff);
    t.rep_.rep_lo_ = (uint32_t)uVar11;
    tVar15 = ToTimeval((lts_20250127 *)unaff_R14,t);
    auVar3 = tVar15._0_12_;
    output = buf->ptr_;
    buffer = (Nonnull<char_*>)buf->len_;
    local_60.cs.f_.y = 0x2d8e58;
    local_60.cs.f_.m = '\x1b';
    local_60.cs.f_.d = '\0';
    local_60.cs.f_.hh = '\0';
    local_60.cs.f_.mm = '\0';
    local_60.cs.f_.ss = '\0';
    local_60.cs.f_._13_3_ = 0;
    if (severity < 4) {
      pcVar10 = (&PTR_anon_var_dwarf_621fad_0035cc38)[severity];
    }
    else {
LAB_0024c491:
      pcVar10 = "UNKNOWN";
    }
    local_70.rep_hi_.lo_ = auVar3._0_4_;
    local_74 = auVar3._8_4_;
    local_78 = iVar14;
    uVar4 = SNPrintF<char,_int,_int,_int>
                      (output,(size_t)buffer,(FormatSpec<char,_int,_int,_int> *)&local_60,pcVar10,
                       (int *)&local_70,&local_74,&local_78);
    if ((int)uVar4 < 0) goto LAB_0024c4da;
    pcVar5 = (Nonnull<char_*>)(ulong)uVar4;
    Span<char>::remove_prefix(buf,(size_type)pcVar5);
    pcVar10 = local_88;
  } while( true );
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}